

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksToSubprojects
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml,string *baseDir)

{
  cmGlobalGenerator *pcVar1;
  bool bVar2;
  string *psVar3;
  _Base_ptr p_Var4;
  allocator<char> local_99;
  cmXMLWriter *local_98;
  string linkName;
  string linkSourceDirectory;
  string local_50;
  
  if (this->GenerateLinkedResources == true) {
    local_98 = xml;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkSourceDirectory,"[Subprojects]",(allocator<char> *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkName,"virtual:/virtual",&local_99);
    AppendLinkedResource(local_98,&linkSourceDirectory,&linkName,VirtualFolder);
    std::__cxx11::string::~string((string *)&linkName);
    std::__cxx11::string::~string((string *)&linkSourceDirectory);
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    for (p_Var4 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      psVar3 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_
                         ((cmLocalGenerator *)**(undefined8 **)(p_Var4 + 2));
      std::__cxx11::string::string((string *)&linkSourceDirectory,(string *)psVar3);
      bVar2 = std::operator!=(baseDir,&linkSourceDirectory);
      if (bVar2) {
        bVar2 = cmsys::SystemTools::IsSubDirectory(baseDir,&linkSourceDirectory);
        if (!bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&linkName,"[Subprojects]/",(allocator<char> *)&local_50);
          std::__cxx11::string::append((string *)&linkName);
          std::__cxx11::string::string((string *)&local_50,(string *)&linkSourceDirectory);
          AppendLinkedResource(local_98,&linkName,&local_50,LinkToFolder);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&linkName);
        }
      }
      std::__cxx11::string::~string((string *)&linkSourceDirectory);
    }
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksToSubprojects(
  cmXMLWriter& xml, const std::string& baseDir)
{
  if (!this->GenerateLinkedResources) {
    return;
  }

  // for each sub project create a linked resource to the source dir
  // - only if it is an out-of-source build
  cmExtraEclipseCDT4Generator::AppendLinkedResource(
    xml, "[Subprojects]", "virtual:/virtual", VirtualFolder);

  for (auto const& it : this->GlobalGenerator->GetProjectMap()) {
    std::string linkSourceDirectory =
      cmExtraEclipseCDT4Generator::GetEclipsePath(
        it.second[0]->GetCurrentSourceDirectory());
    // a linked resource must not point to a parent directory of .project or
    // .project itself
    if ((baseDir != linkSourceDirectory) &&
        !cmSystemTools::IsSubDirectory(baseDir, linkSourceDirectory)) {
      std::string linkName = "[Subprojects]/";
      linkName += it.first;
      cmExtraEclipseCDT4Generator::AppendLinkedResource(
        xml, linkName,
        cmExtraEclipseCDT4Generator::GetEclipsePath(linkSourceDirectory),
        LinkToFolder);
      // Don't add it to the srcLinkedResources, because listing multiple
      // directories confuses the Eclipse indexer (#13596).
    }
  }
}